

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

string * iconv_convert_abi_cxx11_(char *src,size_t len,iconv_t conv)

{
  int *piVar1;
  iconv_t in_RCX;
  string *in_RDI;
  bool bVar2;
  size_t outlen;
  char *bufptr;
  size_t res;
  char buffer [512];
  string out;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *local_258;
  size_t local_250;
  char local_248 [520];
  string local_40 [32];
  iconv_t local_20;
  size_t local_18;
  char *local_10 [2];
  
  local_20 = in_RCX;
  std::__cxx11::string::string(local_40);
  do {
    local_258 = local_248;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200;
    local_250 = iconv(local_20,local_10,&local_18,&local_258,(size_t *)&stack0xfffffffffffffda0);
    std::__cxx11::string::append<char*,void>
              (this,in_stack_fffffffffffffd98,
               (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    bVar2 = false;
    if (local_250 == 0xffffffffffffffff) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 7;
    }
  } while (bVar2);
  if (local_250 == 0xffffffffffffffff) {
    perror("Failed string encoding conversion:");
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_40);
  }
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static std::string iconv_convert(const char* src, size_t len, iconv_t conv) {
	std::string out;
	char buffer[512];
	size_t res;
	do {
		char* bufptr = buffer;
		size_t outlen = sizeof(buffer);
		res = iconv(conv, const_cast<char**>(&src), &len, &bufptr, &outlen);
		out.append(buffer, bufptr);
	} while (res == (size_t)-1 && errno == E2BIG);
	if (res == -1) {
		perror("Failed string encoding conversion:");
		return std::string();
	}
	return out;
}